

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath_error.hpp
# Opt level: O2

string * __thiscall
jsoncons::jmespath::jmespath_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,jmespath_error_category_impl *this,int ev)

{
  char *__s;
  allocator<char> local_9;
  
  switch(ev) {
  case 1:
    __s = "Expected identifier";
    break;
  case 2:
    __s = "Expected index";
    break;
  case 3:
    __s = "Expected A-Z, a-z, or _";
    break;
  case 4:
    __s = "Expected ]";
    break;
  case 5:
    __s = "Expected )";
    break;
  case 6:
    __s = "Expected }";
    break;
  case 7:
    __s = "Expected :";
    break;
  case 8:
    __s = "Expected \".\"";
    break;
  case 9:
    __s = "Expected \"||\"";
    break;
  case 10:
    __s = "Expected \"&&\"";
    break;
  case 0xb:
    __s = "Expected multi-select-list";
    break;
  case 0xc:
    __s = "Invalid number";
    break;
  case 0xd:
    __s = "Invalid literal";
    break;
  case 0xe:
    __s = "Expected <, <=, ==, >=, > or !=";
    break;
  case 0xf:
    __s = "Expected key";
    break;
  case 0x10:
    __s = "Invalid argument type";
    break;
  case 0x11:
    __s = "Unknown function";
    break;
  case 0x12:
    __s = "Invalid type";
    break;
  case 0x13:
    __s = "Unexpected end of jmespath input";
    break;
  case 0x14:
    __s = "Slice step cannot be zero";
    break;
  case 0x15:
    __s = "Syntax error";
    break;
  case 0x16:
    __s = "Invalid codepoint";
    break;
  case 0x17:
    __s = "Illegal escaped character";
    break;
  case 0x18:
    __s = "Unbalanced parentheses";
    break;
  case 0x19:
    __s = "Unbalanced braces";
    break;
  case 0x1a:
    __s = "Function called with wrong number of arguments";
    break;
  case 0x1b:
    __s = "Identifier not found";
    break;
  case 0x1c:
    __s = "Expected index expression";
    break;
  case 0x1d:
    __s = "Undefined variable";
    break;
  default:
    __s = "Unknown jmespath parser error";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
    {
        switch (static_cast<jmespath_errc>(ev))
        {
            case jmespath_errc::expected_identifier:
                return "Expected identifier";
            case jmespath_errc::expected_index:
                return "Expected index";
            case jmespath_errc::expected_A_Za_Z_:
                return "Expected A-Z, a-z, or _";
            case jmespath_errc::expected_rbracket:
                return "Expected ]";
            case jmespath_errc::expected_rparen:
                return "Expected )";
            case jmespath_errc::expected_rbrace:
                return "Expected }";
            case jmespath_errc::expected_colon:
                return "Expected :";
            case jmespath_errc::expected_dot:
                return "Expected \".\"";
            case jmespath_errc::expected_or:
                return "Expected \"||\"";
            case jmespath_errc::expected_and:
                return "Expected \"&&\"";
            case jmespath_errc::expected_multi_select_list:
                return "Expected multi-select-list";
            case jmespath_errc::invalid_number:
                return "Invalid number";
            case jmespath_errc::invalid_literal:
                return "Invalid literal";
            case jmespath_errc::expected_comparator:
                return "Expected <, <=, ==, >=, > or !=";
            case jmespath_errc::expected_key:
                return "Expected key";
            case jmespath_errc::invalid_argument:
                return "Invalid argument type";
            case jmespath_errc::unknown_function:
                return "Unknown function";
            case jmespath_errc::invalid_type:
                return "Invalid type";
            case jmespath_errc::unexpected_end_of_input:
                return "Unexpected end of jmespath input";
            case jmespath_errc::step_cannot_be_zero:
                return "Slice step cannot be zero";
            case jmespath_errc::syntax_error:
                return "Syntax error";
            case jmespath_errc::invalid_codepoint:
                return "Invalid codepoint";
            case jmespath_errc::illegal_escaped_character:
                return "Illegal escaped character";
            case jmespath_errc::unbalanced_parentheses:
                return "Unbalanced parentheses";
            case jmespath_errc::unbalanced_braces:
                return "Unbalanced braces";
            case jmespath_errc::invalid_arity:
                return "Function called with wrong number of arguments";
            case jmespath_errc::identifier_not_found:
                return "Identifier not found";
            case jmespath_errc::expected_index_expression:
                return "Expected index expression";
            case jmespath_errc::undefined_variable:
                return "Undefined variable";
            case jmespath_errc::unknown_error:
            default:
                return "Unknown jmespath parser error";
        }
    }